

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::CopyAttConfig::endCopyAttachmentsFrom(CopyAttConfig *this)

{
  size_t *psVar1;
  element_type *peVar2;
  _Node *p_Var3;
  string local_38;
  
  if ((this->caf).path._M_string_length == 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"copy attachments: no file specified","");
    usage(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  peVar2 = (this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = std::__cxx11::
           list<QPDFJob::CopyAttachmentFrom,std::allocator<QPDFJob::CopyAttachmentFrom>>::
           _M_create_node<QPDFJob::CopyAttachmentFrom_const&>
                     ((list<QPDFJob::CopyAttachmentFrom,std::allocator<QPDFJob::CopyAttachmentFrom>>
                       *)&peVar2->attachments_to_copy,&this->caf);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = (size_t *)
           ((long)&(peVar2->attachments_to_copy).
                   super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>
                   ._M_impl + 0x10);
  *psVar1 = *psVar1 + 1;
  return this->config;
}

Assistant:

QPDFJob::Config*
QPDFJob::CopyAttConfig::endCopyAttachmentsFrom()
{
    if (this->caf.path.empty()) {
        usage("copy attachments: no file specified");
    }
    this->config->o.m->attachments_to_copy.push_back(this->caf);
    return this->config;
}